

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O1

int CfdInitializeMultisigScriptSig(void *handle,void **multisig_handle)

{
  void *pvVar1;
  CfdException *this;
  undefined1 local_50 [32];
  
  cfd::Initialize();
  if (multisig_handle != (void **)0x0) {
    local_50._0_8_ = local_50 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"MultiScriptSig","");
    pvVar1 = cfd::capi::AllocBuffer((string *)local_50,0x15cc);
    *multisig_handle = pvVar1;
    if ((undefined1 *)local_50._0_8_ != local_50 + 0x10) {
      operator_delete((void *)local_50._0_8_);
    }
    return 0;
  }
  local_50._0_8_ = "cfdcapi_script.cpp";
  local_50._8_4_ = 0x113;
  local_50._16_8_ = "CfdInitializeMultisigScriptSig";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_50,kCfdLogLevelWarning,"multisig sign handle is null.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_50._0_8_ = local_50 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"Failed to parameter. multisig sign handle is null.","");
  cfd::core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_50);
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdInitializeMultisigScriptSig(void* handle, void** multisig_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (multisig_handle == nullptr) {
      warn(CFD_LOG_SOURCE, "multisig sign handle is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. multisig sign handle is null.");
    }

    *multisig_handle = AllocBuffer(
        kPrefixMultisigScriptSig, sizeof(CfdCapiMultisigScriptSigData));
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}